

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O2

void EMIT_OP_REG_REG(CodeGenGenericContext *ctx,x86Command op,x86XmmReg reg1,x86XmmReg reg2)

{
  x86Instruction *pxVar1;
  ulong uVar2;
  undefined4 uStack_3c;
  undefined4 uStack_34;
  
  if (op - o_addsd < 9) {
    uVar2 = (ulong)reg2;
    if (ctx->xmmReg[uVar2].type == argXmmReg) {
      reg2 = ctx->xmmReg[uVar2].field_1.reg;
      uVar2 = (ulong)reg2;
    }
    ctx->xmmRegRead[uVar2] = true;
    CodeGenGenericContext::ReadAndModifyRegister(ctx,reg1);
  }
  else if (op - o_cvtss2sd < 2) {
    uVar2 = (ulong)reg2;
    if (ctx->xmmReg[uVar2].type == argXmmReg) {
      reg2 = ctx->xmmReg[uVar2].field_1.reg;
      uVar2 = (ulong)reg2;
    }
    ctx->xmmRegRead[uVar2] = true;
    CodeGenGenericContext::OverwriteRegisterWithUnknown(ctx,reg1);
  }
  else {
    if (op != o_movsd) {
      __assert_fail("!\"unknown instruction\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                    ,0x583,
                    "void EMIT_OP_REG_REG(CodeGenGenericContext &, x86Command, x86XmmReg, x86XmmReg)"
                   );
    }
    if (ctx->xmmReg[reg2].type == argXmmReg) {
      reg2 = ctx->xmmReg[reg2].field_1.reg;
    }
    if (reg2 == reg1) {
      ctx->optimizationCount = ctx->optimizationCount + 1;
      return;
    }
    ctx->xmmRegRead[reg2] = true;
    CodeGenGenericContext::OverwriteRegisterWithValue
              (ctx,reg1,(x86Argument)
                        ZEXT1632(CONCAT88(CONCAT44(uStack_34,reg2),CONCAT44(uStack_3c,3))));
  }
  pxVar1 = ctx->x86Op;
  pxVar1->name = op;
  (pxVar1->argA).type = argXmmReg;
  (pxVar1->argA).field_1.xmmArg = reg1;
  pxVar1 = ctx->x86Op;
  (pxVar1->argB).type = argXmmReg;
  (pxVar1->argB).field_1.xmmArg = reg2;
  ctx->x86Op = ctx->x86Op + 1;
  return;
}

Assistant:

void EMIT_OP_REG_REG(CodeGenGenericContext &ctx, x86Command op, x86XmmReg reg1, x86XmmReg reg2)
{
#ifdef NULLC_OPTIMIZE_X86
	switch(op)
	{
	case o_movsd:
		reg2 = ctx.RedirectRegister(reg2);

		// Skip self-assignment
		if(reg1 == reg2)
		{
			ctx.optimizationCount++;
			return;
		}

		ctx.ReadRegister(reg2);

		ctx.OverwriteRegisterWithValue(reg1, x86Argument(reg2));
		break;
	case o_cvtss2sd:
	case o_cvtsd2ss:
		reg2 = ctx.RedirectRegister(reg2);

		ctx.ReadRegister(reg2);

		ctx.OverwriteRegisterWithUnknown(reg1);
		break;
	case o_addsd:
	case o_subsd:
	case o_mulsd:
	case o_divsd:
	case o_sqrtsd:
	case o_cmpeqsd:
	case o_cmpltsd:
	case o_cmplesd:
	case o_cmpneqsd:
		reg2 = ctx.RedirectRegister(reg2);

		ctx.ReadRegister(reg2);
		ctx.ReadAndModifyRegister(reg1);
		break;
	default:
		assert(!"unknown instruction");
	}
#endif

	ctx.x86Op->name = op;
	ctx.x86Op->argA.type = x86Argument::argXmmReg;
	ctx.x86Op->argA.xmmArg = reg1;
	ctx.x86Op->argB.type = x86Argument::argXmmReg;
	ctx.x86Op->argB.xmmArg = reg2;
	ctx.x86Op++;
}